

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

int divsufsortxx::substring::compare<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BitmapArray<long> *pBVar4;
  char *pcVar5;
  char *pcVar6;
  BitmapArray<long> *pBVar7;
  char *pcVar8;
  
  pBVar4 = p2.array_;
  pBVar7 = p1.array_;
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,p1.pos_);
  pcVar6 = T + CONCAT44(extraout_var,iVar1) + depth;
  iVar1 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,p2.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,p1.pos_ + 1);
  iVar3 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,p2.pos_ + 1);
  pcVar5 = T + CONCAT44(extraout_var_02,iVar3) + 2;
  for (pcVar8 = T + CONCAT44(extraout_var_00,iVar1) + depth;
      (pcVar6 < T + CONCAT44(extraout_var_01,iVar2) + 2 && (pcVar8 < pcVar5)); pcVar8 = pcVar8 + 1)
  {
    if (*pcVar6 != *pcVar8) goto LAB_0010a72e;
    pcVar6 = pcVar6 + 1;
  }
  if (pcVar6 < T + CONCAT44(extraout_var_01,iVar2) + 2) {
    if (pcVar8 < pcVar5) {
LAB_0010a72e:
      iVar1 = (uint)(*pcVar8 < *pcVar6) * 2 + -1;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = -(uint)(pcVar8 < pcVar5);
  }
  return iVar1;
}

Assistant:

int compare(StringIterator_type T, const SAIterator_type p1,
            const SAIterator_type p2,
            typename std::iterator_traits<SAIterator_type>::value_type depth) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + *(p1 + 1) + 2, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}